

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_iface.hpp
# Opt level: O2

bool __thiscall
Args::GroupIface::isMisspelledName(GroupIface *this,String *name,StringList *possibleNames)

{
  anon_class_24_3_1ddcd56a __f;
  bool ret;
  bool local_39;
  String *local_38;
  StringList *pSStack_30;
  bool *local_28;
  anon_class_24_3_1ddcd56a local_20;
  
  local_28 = &local_39;
  local_39 = false;
  __f.possibleNames = possibleNames;
  __f.name = name;
  __f.ret = local_28;
  local_38 = name;
  pSStack_30 = possibleNames;
  std::
  for_each<__gnu_cxx::__normal_iterator<std::unique_ptr<Args::ArgIface,Args::details::Deleter<Args::ArgIface>>const*,std::vector<std::unique_ptr<Args::ArgIface,Args::details::Deleter<Args::ArgIface>>,std::allocator<std::unique_ptr<Args::ArgIface,Args::details::Deleter<Args::ArgIface>>>>>,Args::GroupIface::isMisspelledName(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)const::_lambda(auto:1_const&)_1_>
            (&local_20,
             (this->m_children).
             super__Vector_base<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_std::allocator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start,
             (this->m_children).
             super__Vector_base<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_std::allocator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish,__f);
  return local_39;
}

Assistant:

bool isMisspelledName(
		//! Name to check (misspelled).
		const String & name,
		//! List of possible names for the given misspelled name.
		StringList & possibleNames ) const override
	{
		bool ret = false;

		std::for_each( children().cbegin(), children().cend(),
			[ & ] ( const auto & ch )
			{
				if( ch->isMisspelledName( name, possibleNames ) )
					ret = true;
			} );

		return ret;
	}